

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O1

uint __thiscall ON_SubDLevel::UpdateVertexTags(ON_SubDLevel *this,bool bUnsetVertexTagsOnly)

{
  ON_SubDVertexTag OVar1;
  ON_SubDVertex *pOVar2;
  ON_SubDVertexTag OVar3;
  uint uVar4;
  ON_SubDVertex *this_00;
  
  if (this->m_vertex[0] == (ON_SubDVertex *)0x0) {
    uVar4 = 0;
  }
  else {
    uVar4 = 0;
    this_00 = this->m_vertex[0];
    do {
      pOVar2 = this_00->m_next_vertex;
      OVar1 = this_00->m_vertex_tag;
      if (((!bUnsetVertexTagsOnly) || (OVar1 == Unset)) &&
         (OVar3 = ON_SubDVertex::SuggestedVertexTag(this_00,true,false),
         OVar1 != OVar3 && OVar3 != Unset)) {
        this_00->m_vertex_tag = OVar3;
        uVar4 = uVar4 + 1;
      }
      this_00 = pOVar2;
    } while (pOVar2 != (ON_SubDVertex *)0x0);
  }
  return uVar4;
}

Assistant:

unsigned int ON_SubDLevel::UpdateVertexTags(
  bool bUnsetVertexTagsOnly
  )
{
  // Update edge flags and sector coefficients.
  unsigned int vertex_change_count = 0;
 

  ON_SubDVertex* next_vertex = m_vertex[0];
  for (ON_SubDVertex* vertex = next_vertex; nullptr != vertex; vertex = next_vertex)
  {
    next_vertex = const_cast<ON_SubDVertex*>(vertex->m_next_vertex);

    const ON_SubDVertexTag vertex_tag0 = vertex->m_vertex_tag;
    if (bUnsetVertexTagsOnly && ON_SubDVertexTag::Unset != vertex_tag0 )
    {
      continue;
    }

    const ON_SubDVertexTag vertex_tag1 = vertex->SuggestedVertexTag(true, false);
    if (ON_SubDVertexTag::Unset == vertex_tag1)
      continue;

    if ( vertex_tag0 != vertex_tag1)
    {
      vertex->m_vertex_tag = vertex_tag1;
      vertex_change_count++;
    }
  }

  return vertex_change_count;
}